

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O1

char * bloaty::GetDataSourceLabel(DataSource source)

{
  DataSource *pDVar1;
  ulong uVar2;
  char *pcVar3;
  undefined1 *puVar4;
  undefined1 *puVar5;
  int in_register_0000003c;
  bool bVar6;
  
  if (source == kArchiveMembers) {
    puVar4 = data_sources;
    bVar6 = false;
  }
  else {
    uVar2 = 0xffffffffffffffff;
    puVar5 = data_sources;
    do {
      if (uVar2 == 8) {
        pcVar3 = (char *)0x9;
        bVar6 = true;
        goto LAB_0016daa2;
      }
      puVar4 = puVar5 + 0x18;
      uVar2 = uVar2 + 1;
      pDVar1 = (DataSource *)(puVar5 + 0x18);
      puVar5 = puVar4;
    } while (*pDVar1 != source);
    bVar6 = 8 < uVar2;
  }
  pcVar3 = *(char **)(puVar4 + 8);
LAB_0016daa2:
  if (!bVar6) {
    return pcVar3;
  }
  GetDataSourceLabel((bloaty *)CONCAT44(in_register_0000003c,source));
  pcVar3 = (char *)0xffffffff;
  if (-1 < in_register_0000003c) {
    pcVar3 = (char *)(ulong)(CONCAT44(in_register_0000003c,source) != 0);
  }
  return pcVar3;
}

Assistant:

const char* GetDataSourceLabel(DataSource source) {
  for (size_t i = 0; i < ARRAY_SIZE(data_sources); i++) {
    if (data_sources[i].number == source) {
      return data_sources[i].name;
    }
  }
  fprintf(stderr, "Unknown data source label: %d\n", static_cast<int>(source));
  exit(1);
  return nullptr;
}